

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O0

objnum objget1sc(mcmcxdef *ctx,objnum objn)

{
  uint uVar1;
  int iVar2;
  uchar *puVar3;
  objnum retval;
  objdef *p;
  mcmon in_stack_ffffffffffffffde;
  undefined6 in_stack_ffffffffffffffe0;
  mcmon in_stack_ffffffffffffffe6;
  objnum oVar4;
  mcmcxdef *in_stack_ffffffffffffffe8;
  
  puVar3 = mcmlck(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe6);
  uVar1 = osrp2(puVar3 + 4);
  if ((uVar1 & 0xffff) == 0) {
    oVar4 = 0xffff;
  }
  else {
    iVar2 = osrp2(puVar3 + 0xe);
    oVar4 = (objnum)iVar2;
  }
  mcmunlck((mcmcxdef *)CONCAT26(oVar4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffde);
  return oVar4;
}

Assistant:

objnum objget1sc(mcmcxdef *ctx, objnum objn)
{
    objdef *p;
    objnum  retval;

    /* lock the object */
    p = mcmlck(ctx, (mcmon)objn);

    /* get the first superclass if it has any */
    if (objnsc(p) == 0)
        retval = MCMONINV;
    else
        retval = osrp2(objsc(p));

    /* unlock the object and return the superclass value */
    mcmunlck(ctx, (mcmon)objn);
    return retval;
}